

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

TestCaseData * __thiscall doctest::TestCaseData::operator=(TestCaseData *this,TestCaseData *param_1)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined3 uVar10;
  int iVar11;
  undefined4 uVar12;
  
  String::operator=(&this->m_file,&param_1->m_file);
  uVar4 = *(undefined4 *)&param_1->field_0x1c;
  pcVar1 = param_1->m_name;
  pcVar2 = param_1->m_test_suite;
  pcVar3 = param_1->m_description;
  bVar5 = param_1->m_skip;
  bVar6 = param_1->m_no_breaks;
  bVar7 = param_1->m_no_output;
  bVar8 = param_1->m_may_fail;
  bVar9 = param_1->m_should_fail;
  uVar10 = *(undefined3 *)&param_1->field_0x3d;
  iVar11 = param_1->m_expected_failures;
  uVar12 = *(undefined4 *)&param_1->field_0x44;
  this->m_line = param_1->m_line;
  *(undefined4 *)&this->field_0x1c = uVar4;
  this->m_name = pcVar1;
  this->m_test_suite = pcVar2;
  this->m_description = pcVar3;
  this->m_skip = bVar5;
  this->m_no_breaks = bVar6;
  this->m_no_output = bVar7;
  this->m_may_fail = bVar8;
  this->m_should_fail = bVar9;
  *(undefined3 *)&this->field_0x3d = uVar10;
  this->m_expected_failures = iVar11;
  *(undefined4 *)&this->field_0x44 = uVar12;
  this->m_timeout = param_1->m_timeout;
  return this;
}

Assistant:

struct DOCTEST_INTERFACE TestCaseData
{
    String      m_file;       // the file in which the test was registered (using String - see #350)
    unsigned    m_line;       // the line where the test was registered
    const char* m_name;       // name of the test case
    const char* m_test_suite; // the test suite in which the test was added
    const char* m_description;
    bool        m_skip;
    bool        m_no_breaks;
    bool        m_no_output;
    bool        m_may_fail;
    bool        m_should_fail;
    int         m_expected_failures;
    double      m_timeout;
}